

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

UniValue * __thiscall
RPCHelpMan::HandleRequest(UniValue *__return_storage_ptr__,RPCHelpMan *this,JSONRPCRequest *request)

{
  RPCResult *pRVar1;
  string key;
  UniValue val;
  UniValue val_00;
  bool bVar2;
  int iVar3;
  UniValue *pUVar4;
  runtime_error *prVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  RPCResult *this_00;
  pointer pRVar6;
  RPCArg *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  pointer pcVar7;
  long lVar8;
  long in_FS_OFFSET;
  UniValue *ret;
  UniValue match_1;
  UniValue match;
  UniValue arg_mismatch;
  undefined8 in_stack_fffffffffffffd48;
  UniValue *in_stack_fffffffffffffd58;
  string *strArg;
  RPCHelpMan *fmt;
  undefined1 auVar9 [32];
  undefined1 in_stack_fffffffffffffd70 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  pointer in_stack_fffffffffffffdb8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  vector<UniValue,_std::allocator<UniValue>_> local_210;
  undefined1 local_1f8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  vector<UniValue,_std::allocator<UniValue>_> local_1b8;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [9];
  undefined4 local_187;
  undefined2 local_183;
  char local_181;
  VType local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  size_type local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  vector<UniValue,_std::allocator<UniValue>_> local_140;
  string local_128;
  undefined1 local_108 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  vector<UniValue,_std::allocator<UniValue>_> vStack_c8;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [9];
  undefined4 local_97;
  undefined2 local_93;
  char local_91;
  undefined1 local_90 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<UniValue,_std::allocator<UniValue>_> vStack_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (request->mode == GET_ARGS) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      GetArgMap(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    goto LAB_00db66bc;
  }
  if ((request->mode == GET_HELP) ||
     (bVar2 = IsValidNumArgs(this,((long)(request->params).values.
                                         super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                   (long)(request->params).values.
                                         super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                                         _M_impl.super__Vector_impl_data._M_start >> 3) *
                                  0x2e8ba2e8ba2e8ba3), !bVar2)) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    ToString_abi_cxx11_((string *)local_90,this);
    std::runtime_error::runtime_error(prVar5,(string *)local_90);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_00db66bc;
  }
  local_b0 = local_a0;
  local_a8 = 0;
  local_90._8_8_ = &local_78;
  local_90._0_4_ = VOBJ;
  local_78._M_local_buf[0] = '\0';
  local_78._1_7_ = (undefined7)local_a0._1_8_;
  local_78._M_local_buf[8] = SUB81(local_a0._1_8_,7);
  local_78._9_4_ = local_97;
  local_78._13_2_ = local_93;
  local_78._M_local_buf[0xf] = local_91;
  local_90._16_8_ = 0;
  local_a0[0] = 0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pRVar6 = (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
      super__Vector_impl_data._M_finish != pRVar6) {
    in_stack_fffffffffffffd58 = &request->params;
    lVar8 = 0;
    pcVar7 = (pointer)0x1;
    do {
      pUVar4 = ::UniValue::operator[](in_stack_fffffffffffffd58,(size_t)(pcVar7 + -1));
      this_01 = (RPCArg *)((long)&(pRVar6->m_names)._M_dataplus._M_p + lVar8);
      ::RPCArg::MatchesType((UniValue *)local_108,this_01,pUVar4);
      if ((local_108._0_4_ != VBOOL) ||
         (iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_108 + 8),"1"), iVar3 != 0)) {
        local_1f8._0_8_ = pcVar7;
        tinyformat::format<unsigned_long,std::__cxx11::string>
                  (&local_128,(tinyformat *)"Position %s (%s)",local_1f8,(unsigned_long *)this_01,
                   in_R8);
        local_180 = local_108._0_4_;
        local_178 = &local_168;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._8_8_ != &local_f0) {
          local_178 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_108._8_8_;
        }
        local_168._M_allocated_capacity._1_7_ = local_f0._M_allocated_capacity._1_7_;
        local_168._M_local_buf[0] = local_f0._M_local_buf[0];
        local_170 = local_108._16_8_;
        local_108._16_8_ = 0;
        local_f0._M_local_buf[0] = '\0';
        local_158.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_e0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_158.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_e0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_158.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_e0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_e0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_e0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_e0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_140.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start =
             vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_140.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish =
             vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_140.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        key._M_string_length = (size_type)__return_storage_ptr__;
        key._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd48;
        key.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffd58;
        key.field_2._8_8_ = this;
        auVar9 = in_stack_fffffffffffffd70._0_32_;
        val_00.val._M_dataplus._M_p = (pointer)auVar9._0_8_;
        val_00.val._M_string_length = auVar9._8_8_;
        val_00.val.field_2 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )auVar9._16_16_;
        val_00.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffd70._32_8_;
        val_00.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd70._40_8_;
        val_00._0_8_ = request;
        val_00._56_16_ = in_stack_fffffffffffffda0;
        val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffffdb0;
        val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffffdb4;
        val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffdb8;
        local_108._8_8_ = &local_f0;
        ::UniValue::pushKV((UniValue *)local_90,key,val_00);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_140);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_158);
        if (local_178 != &local_168) {
          operator_delete(local_178,local_168._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
      }
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_c8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._8_8_ != &local_f0) {
        operator_delete((void *)local_108._8_8_,
                        CONCAT71(local_f0._M_allocated_capacity._1_7_,local_f0._M_local_buf[0]) + 1)
        ;
      }
      pRVar6 = (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x108;
      bVar2 = pcVar7 < (pointer)(((long)(this->m_args).
                                        super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)pRVar6 >> 3) *
                                0xf83e0f83e0f83e1);
      pcVar7 = pcVar7 + 1;
    } while (bVar2);
  }
  iVar3 = (int)in_stack_fffffffffffffd58;
  if (vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    ::UniValue::write_abi_cxx11_((UniValue *)local_1f8,(int)local_90,(void *)0x4,0);
    tinyformat::format<std::__cxx11::string>
              ((string *)local_108,(tinyformat *)"Wrong type passed:\n%s",local_1f8,args);
    JSONRPCError(pUVar4,-3,(string *)local_108);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(pUVar4,&::UniValue::typeinfo,::UniValue::~UniValue);
    }
    goto LAB_00db66bc;
  }
  local_108[0] = this->m_req == (JSONRPCRequest *)0x0;
  fmt = this;
  inline_check_non_fatal<bool>
            ((bool *)local_108,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
             ,0x298,"HandleRequest","m_req == nullptr");
  this->m_req = request;
  if ((this->m_fun).super__Function_base._M_manager == (_Manager_type)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00db66bc;
    std::__throw_bad_function_call();
LAB_00db635e:
    if (vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_1f8._0_8_ = local_1f8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1f8,"no possible results defined","");
    }
    else {
      if ((long)vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start == 0x58) {
        pUVar4 = ::UniValue::operator[]((UniValue *)local_108,0);
        iVar3 = (int)pUVar4;
      }
      ::UniValue::write_abi_cxx11_((UniValue *)local_1f8,iVar3,(void *)0x4,0);
    }
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    FormatFullVersion_abi_cxx11_();
    tinyformat::
    format<std::__cxx11::string,std::__cxx11::string,char[13],std::__cxx11::string,char[42]>
              ((string *)&stack0xfffffffffffffd90,
               (tinyformat *)
               "Internal bug detected: RPC call \"%s\" returned incorrect type:\n%s\n%s %s\nPlease report this issue here: %s\n"
               ,(char *)fmt,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Bitcoin Core",
               (char (*) [13])&stack0xfffffffffffffd70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "https://github.com/bitcoin/bitcoin/issues",(char (*) [42])__return_storage_ptr__);
    std::runtime_error::runtime_error(prVar5,(string *)&stack0xfffffffffffffd90);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    (*(this->m_fun)._M_invoker)(__return_storage_ptr__,(_Any_data *)&this->m_fun,this,request);
    this->m_req = (JSONRPCRequest *)0x0;
    local_108._0_8_ = local_108 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"-rpcdoccheck","");
    strArg = (string *)local_108;
    bVar2 = ArgsManager::GetBoolArg(&gArgs,strArg,false);
    if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    if (bVar2) {
      local_1a0 = local_190;
      local_198 = 0;
      local_108._8_8_ = &local_f0;
      local_108._0_4_ = 2;
      local_f0._M_local_buf[0] = '\0';
      local_f0._M_allocated_capacity._1_7_ = (undefined7)local_190._1_8_;
      local_f0._M_local_buf[8] = SUB81(local_190._1_8_,7);
      local_f0._9_4_ = local_187;
      local_f0._13_2_ = local_183;
      local_f0._M_local_buf[0xf] = local_181;
      local_108._16_8_ = 0;
      local_190[0] = 0;
      local_e0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_00 = (this->m_results).m_results.
                super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                super__Vector_impl_data._M_start;
      pRVar1 = (this->m_results).m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (this_00 != pRVar1) {
        do {
          ::RPCResult::MatchesType((UniValue *)local_1f8,this_00,__return_storage_ptr__);
          if (local_1f8._0_4_ == VBOOL) {
            iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (local_1f8 + 8),"1");
            bVar2 = iVar3 == 0;
          }
          else {
            bVar2 = false;
          }
          if (bVar2) {
            ::UniValue::setNull((UniValue *)local_108);
          }
          else {
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f8._8_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._8_8_ == &local_1e0) {
              local_238._8_8_ = local_1e0._8_8_;
              paVar10 = &local_238;
            }
            local_238._M_allocated_capacity._1_7_ = local_1e0._M_allocated_capacity._1_7_;
            local_238._M_local_buf[0] = local_1e0._M_local_buf[0];
            local_1f8._16_8_ = 0;
            local_1e0._M_local_buf[0] = '\0';
            local_228.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_1d0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_228.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_1d0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_228.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_1d0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_1d0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_1d0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_1d0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_210.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_1b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_210.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_1b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_210.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_1b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            local_1b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_1b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_1b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            val.val._M_dataplus._M_p = (pointer)__return_storage_ptr__;
            val._0_8_ = in_stack_fffffffffffffd48;
            val.val._M_string_length = (size_type)strArg;
            val.val.field_2._M_allocated_capacity = (size_type)fmt;
            val.val.field_2._8_8_ = request;
            val.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data =
                 (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )in_stack_fffffffffffffd70._0_24_;
            val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data =
                 (_Vector_base<UniValue,_std::allocator<UniValue>_>)
                 (_Vector_base<UniValue,_std::allocator<UniValue>_>)
                 in_stack_fffffffffffffd70._24_24_;
            local_1f8._8_8_ = &local_1e0;
            ::UniValue::push_back((UniValue *)local_108,val);
            std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_210);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_228);
            if (paVar10 != &local_238) {
              operator_delete(paVar10,local_238._M_allocated_capacity + 1);
            }
          }
          std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_1b8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._8_8_ != &local_1e0) {
            operator_delete((void *)local_1f8._8_8_,
                            CONCAT71(local_1e0._M_allocated_capacity._1_7_,local_1e0._M_local_buf[0]
                                    ) + 1);
          }
          this_00 = this_00 + 1;
        } while (!bVar2 && this_00 != pRVar1);
      }
      iVar3 = (int)strArg;
      if (local_108._0_4_ != VNULL) goto LAB_00db635e;
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_c8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._8_8_ != &local_f0) {
        operator_delete((void *)local_108._8_8_,
                        CONCAT71(local_f0._M_allocated_capacity._1_7_,local_f0._M_local_buf[0]) + 1)
        ;
      }
    }
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._8_8_ != &local_78) {
      operator_delete((void *)local_90._8_8_,CONCAT71(local_78._1_7_,local_78._M_local_buf[0]) + 1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
  }
LAB_00db66bc:
  __stack_chk_fail();
}

Assistant:

UniValue RPCHelpMan::HandleRequest(const JSONRPCRequest& request) const
{
    if (request.mode == JSONRPCRequest::GET_ARGS) {
        return GetArgMap();
    }
    /*
     * Check if the given request is valid according to this command or if
     * the user is asking for help information, and throw help when appropriate.
     */
    if (request.mode == JSONRPCRequest::GET_HELP || !IsValidNumArgs(request.params.size())) {
        throw std::runtime_error(ToString());
    }
    UniValue arg_mismatch{UniValue::VOBJ};
    for (size_t i{0}; i < m_args.size(); ++i) {
        const auto& arg{m_args.at(i)};
        UniValue match{arg.MatchesType(request.params[i])};
        if (!match.isTrue()) {
            arg_mismatch.pushKV(strprintf("Position %s (%s)", i + 1, arg.m_names), std::move(match));
        }
    }
    if (!arg_mismatch.empty()) {
        throw JSONRPCError(RPC_TYPE_ERROR, strprintf("Wrong type passed:\n%s", arg_mismatch.write(4)));
    }
    CHECK_NONFATAL(m_req == nullptr);
    m_req = &request;
    UniValue ret = m_fun(*this, request);
    m_req = nullptr;
    if (gArgs.GetBoolArg("-rpcdoccheck", DEFAULT_RPC_DOC_CHECK)) {
        UniValue mismatch{UniValue::VARR};
        for (const auto& res : m_results.m_results) {
            UniValue match{res.MatchesType(ret)};
            if (match.isTrue()) {
                mismatch.setNull();
                break;
            }
            mismatch.push_back(std::move(match));
        }
        if (!mismatch.isNull()) {
            std::string explain{
                mismatch.empty() ? "no possible results defined" :
                mismatch.size() == 1 ? mismatch[0].write(4) :
                mismatch.write(4)};
            throw std::runtime_error{
                strprintf("Internal bug detected: RPC call \"%s\" returned incorrect type:\n%s\n%s %s\nPlease report this issue here: %s\n",
                          m_name, explain,
                          PACKAGE_NAME, FormatFullVersion(),
                          PACKAGE_BUGREPORT)};
        }
    }
    return ret;
}